

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeFractionFormat
          (ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  ParsedSubpatternInfo *pPVar1;
  UChar32 UVar2;
  uint uVar3;
  int leadingZeros;
  
  pPVar1 = this->currentSubpattern;
  this_00 = &this->state;
  leadingZeros = 0;
  do {
    UVar2 = ParserState::peek(this_00);
    if (UVar2 - 0x30U < 10) {
      if (0 < pPVar1->fractionHashSigns) {
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->fractionNumerals = pPVar1->fractionNumerals + 1;
      pPVar1->fractionTotal = pPVar1->fractionTotal + 1;
      UVar2 = ParserState::peek(this_00);
      if (UVar2 == 0x30) goto LAB_00267921;
      UVar2 = ParserState::peek(this_00);
      DecimalQuantity::appendDigit(&pPVar1->rounding,(char)UVar2 + -0x30,leadingZeros,false);
      leadingZeros = 0;
    }
    else {
      if (UVar2 != 0x23) {
        return;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->fractionHashSigns = pPVar1->fractionHashSigns + 1;
      pPVar1->fractionTotal = pPVar1->fractionTotal + 1;
LAB_00267921:
      leadingZeros = leadingZeros + 1;
    }
    uVar3 = ParserState::peek(this_00);
    (this->state).offset = ((this->state).offset - (uint)(uVar3 < 0x10000)) + 2;
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeFractionFormat(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    int32_t zeroCounter = 0;
    while (true) {
        switch (state.peek()) {
            case u'#':
                result.widthExceptAffixes += 1;
                result.fractionHashSigns += 1;
                result.fractionTotal += 1;
                zeroCounter++;
                break;

            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
                if (result.fractionHashSigns > 0) {
                    state.toParseException(u"0 cannot follow # after decimal point");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.fractionNumerals += 1;
                result.fractionTotal += 1;
                if (state.peek() == u'0') {
                    zeroCounter++;
                } else {
                    result.rounding
                            .appendDigit(static_cast<int8_t>(state.peek() - u'0'), zeroCounter, false);
                    zeroCounter = 0;
                }
                break;

            default:
                return;
        }
        state.next(); // consume the symbol
    }
}